

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::packRows(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  U *pUVar1;
  int iVar2;
  int iVar3;
  pointer pnVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  pointer pnVar8;
  int *piVar9;
  int *piVar10;
  int iVar11;
  Dring *pDVar12;
  long lVar13;
  cpp_dec_float<200U,_int,_void> *v;
  cpp_dec_float<200U,_int,_void> *this_00;
  long lVar14;
  
  pUVar1 = &this->u;
  pnVar4 = (this->u).row.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar5 = (this->u).row.idx;
  piVar6 = (this->u).row.len;
  piVar9 = (this->u).row.max;
  piVar7 = (this->u).row.start;
  iVar11 = 0;
  pDVar12 = (Dring *)pUVar1;
  while (pDVar12 = (((Row *)&pDVar12->next)->list).next, (U *)pDVar12 != pUVar1) {
    iVar2 = pDVar12->idx;
    if (piVar7[iVar2] != iVar11) goto LAB_003f0efd;
    iVar3 = piVar6[iVar2];
    iVar11 = iVar11 + iVar3;
    piVar9[iVar2] = iVar3;
  }
LAB_003f0f9a:
  piVar9[this->thedim] = 0;
  (this->u).row.used = iVar11;
  return;
LAB_003f0efd:
  do {
    iVar2 = pDVar12->idx;
    lVar14 = (long)piVar7[iVar2];
    piVar7[iVar2] = iVar11;
    iVar3 = piVar6[iVar2];
    piVar9[iVar2] = iVar3;
    lVar13 = iVar3 + lVar14;
    piVar10 = piVar5 + iVar11;
    this_00 = &pnVar4[iVar11].m_backend;
    v = (cpp_dec_float<200U,_int,_void> *)(lVar14 << 7);
    pnVar8 = pnVar4;
    for (; v = (cpp_dec_float<200U,_int,_void> *)((long)(v->data)._M_elems + (long)pnVar8),
        lVar14 < lVar13; lVar14 = lVar14 + 1) {
      *piVar10 = piVar5[lVar14];
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,v);
      iVar11 = iVar11 + 1;
      piVar10 = piVar10 + 1;
      pnVar8 = (pointer)0x80;
      this_00 = this_00 + 1;
    }
    pDVar12 = pDVar12->next;
  } while ((U *)pDVar12 != pUVar1);
  piVar9 = (this->u).row.max;
  goto LAB_003f0f9a;
}

Assistant:

void CLUFactor<R>::packRows()
{
   int n, i, j, l_row;
   Dring* ring, *list;

   int* l_ridx = u.row.idx;
   R* l_rval = u.row.val.data();
   int* l_rlen = u.row.len;
   int* l_rmax = u.row.max;
   int* l_rbeg = u.row.start;

   n = 0;
   list = &(u.row.list);

   for(ring = list->next; ring != list; ring = ring->next)
   {
      l_row = ring->idx;

      if(l_rbeg[l_row] != n)
      {
         do
         {
            l_row = ring->idx;
            i = l_rbeg[l_row];
            assert(l_rlen[l_row] <= l_rmax[l_row]);
            l_rbeg[l_row] = n;
            l_rmax[l_row] = l_rlen[l_row];
            j = i + l_rlen[l_row];

            for(; i < j; ++i, ++n)
            {
               assert(n <= i);
               l_ridx[n] = l_ridx[i];
               l_rval[n] = l_rval[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackRows;
      }

      n += l_rlen[l_row];

      l_rmax[l_row] = l_rlen[l_row];
   }

terminatePackRows:

   u.row.max[thedim] = 0;
   u.row.used = n;
}